

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

void * agent_main(void *arg)

{
  int iVar1;
  pthread_t __th;
  time_t tVar2;
  ulong uVar3;
  long *in_FS_OFFSET;
  ulong local_100;
  char local_f8 [8];
  char hostname [64];
  size_t __cpu;
  int s;
  pthread_t thread;
  cpu_set_t cpuset;
  void *arg_local;
  
  cpuset.__bits[0xf] = (__cpu_mask)arg;
  __th = pthread_self();
  *(int *)(*in_FS_OFFSET + -0x628) = (int)cpuset.__bits[0xf];
  init_per_thread_stats();
  tVar2 = time((time_t *)0x0);
  srand((int)tVar2 + *(int *)(*in_FS_OFFSET + -0x628) * 0x3039);
  memset(&thread,0,0x80);
  iVar1 = *(int *)(*in_FS_OFFSET + -0x628);
  if ((ulong)(long)iVar1 >> 3 < 0x80) {
    uVar3 = (ulong)(long)iVar1 >> 6;
    local_100 = 1L << ((byte)iVar1 & 0x3f) | cpuset.__bits[uVar3 - 1];
    cpuset.__bits[uVar3 - 1] = local_100;
  }
  else {
    local_100 = 0;
  }
  hostname[0x38] = (undefined1)local_100;
  hostname[0x39] = local_100._1_1_;
  hostname[0x3a] = local_100._2_1_;
  hostname[0x3b] = local_100._3_1_;
  hostname[0x3c] = local_100._4_1_;
  hostname[0x3d] = local_100._5_1_;
  hostname[0x3e] = local_100._6_1_;
  hostname[0x3f] = local_100._7_1_;
  iVar1 = pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&thread);
  if (iVar1 == 0) {
    (*cfg->tp->tp_main[cfg->atype])();
  }
  else {
    gethostname(local_f8,0x40);
    fprintf(_stderr,"[%s] ",local_f8);
    perror("pthread_setaffinity_np");
  }
  return (void *)0x0;
}

Assistant:

static void *agent_main(void *arg)
{
	cpu_set_t cpuset;
	pthread_t thread;
	int s;

	thread = pthread_self();
	thread_idx = (int)(long)arg;
	init_per_thread_stats();

	srand(time(NULL) + thread_idx * 12345);

	CPU_ZERO(&cpuset);
	CPU_SET(thread_idx, &cpuset);

	s = pthread_setaffinity_np(thread, sizeof(cpu_set_t), &cpuset);
	if (s != 0) {
		lancet_perror("pthread_setaffinity_np");
		return NULL;
	}
	cfg->tp->tp_main[cfg->atype]();

	return NULL;
}